

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::EndIntOverflowDoesNotMatterRange(BackwardPass *this)

{
  BasicBlock *this_00;
  IntOverflowDoesNotMatterRange *pIVar1;
  Instr *instr;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  Type pJVar3;
  Type pBVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  PragmaInstr *this_01;
  JITTimeFunctionBody *pJVar6;
  FunctionJITTimeInfo *pFVar7;
  char16 *pcVar8;
  char16 *pcVar9;
  Type_conflict pBVar10;
  Type_conflict pBVar11;
  IntOverflowDoesNotMatterRange *rangeToDelete;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  if (this->intOverflowCurrentlyMattersInRange == false) {
    this->intOverflowCurrentlyMattersInRange = true;
    this_00 = this->currentBlock;
    pIVar1 = this_00->intOverflowDoesNotMatterRange;
    instr = pIVar1->lastInstr;
    if (pIVar1->firstInstr->m_next == instr) {
      this_00->intOverflowDoesNotMatterRange = pIVar1->next;
      BasicBlock::RemoveInstr(this_00,instr);
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,IntOverflowDoesNotMatterRange>
                (this->globOpt->alloc,pIVar1);
    }
    else {
      this_01 = IR::PragmaInstr::New(NoIntOverflowBoundary,0,pIVar1->firstInstr->m_func);
      IR::Instr::SetByteCodeOffset
                (&this_01->super_Instr,this->currentBlock->intOverflowDoesNotMatterRange->firstInstr
                );
      BasicBlock::InsertInstrBefore
                (this->currentBlock,&this_01->super_Instr,
                 this->currentBlock->intOverflowDoesNotMatterRange->firstInstr);
      this->currentBlock->intOverflowDoesNotMatterRange->firstInstr = &this_01->super_Instr;
      pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar6);
      pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      functionId = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
      bVar5 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,TrackCompoundedIntOverflowPhase,sourceContextId,
                         functionId);
      if (bVar5) {
        pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar6);
        pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        pcVar9 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar7,(wchar (*) [42])local_78);
        Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n",
                      pcVar8,pcVar9,L"Backward",(ulong)this->currentBlock->number);
        Output::Print(L"    Input syms to be int-specialized (lossless): ");
        pIVar1 = this->currentBlock->intOverflowDoesNotMatterRange;
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (this->candidateSymsRequiredToBeInt,&pIVar1->symsRequiredToBeInt,
                   &pIVar1->symsRequiredToBeLossyInt);
        BVSparse<Memory::JitArenaAllocator>::Dump(this->candidateSymsRequiredToBeInt);
        Output::Print(L"    Input syms to be converted to int (lossy):   ");
        BVSparse<Memory::JitArenaAllocator>::Dump
                  (&this->currentBlock->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt);
        Output::Print(L"    First instr: ");
        IR::Instr::Dump(this->currentBlock->intOverflowDoesNotMatterRange->firstInstr->m_next);
        Output::Flush();
      }
    }
    pBVar2 = this->candidateSymsRequiredToBeInt;
    if (pBVar2->head != (Type_conflict)0x0) {
      pJVar3 = pBVar2->alloc;
      pBVar4 = pBVar2->head;
      pBVar11 = pJVar3->bvFreeList;
      do {
        pBVar10 = pBVar4;
        pBVar4 = pBVar10->next;
        pBVar10->next = pBVar11;
        pBVar11 = pBVar10;
      } while (pBVar4 != (Type)0x0);
      pJVar3->bvFreeList = pBVar10;
    }
    pBVar2->head = (Type_conflict)0x0;
    pBVar2->lastFoundIndex = (Type_conflict)0x0;
    pBVar2->lastUsedNodePrevNextField = &pBVar2->head;
    pBVar2 = this->candidateSymsRequiredToBeLossyInt;
    if (pBVar2->head != (Type_conflict)0x0) {
      pJVar3 = pBVar2->alloc;
      pBVar4 = pBVar2->head;
      pBVar11 = pJVar3->bvFreeList;
      do {
        pBVar10 = pBVar4;
        pBVar4 = pBVar10->next;
        pBVar10->next = pBVar11;
        pBVar11 = pBVar10;
      } while (pBVar4 != (Type)0x0);
      pJVar3->bvFreeList = pBVar10;
    }
    pBVar2->head = (Type_conflict)0x0;
    pBVar2->lastFoundIndex = (Type_conflict)0x0;
    pBVar2->lastUsedNodePrevNextField = &pBVar2->head;
    pBVar2 = this->intOverflowDoesNotMatterInRangeBySymId;
    if (pBVar2->head != (Type_conflict)0x0) {
      pJVar3 = pBVar2->alloc;
      pBVar4 = pBVar2->head;
      pBVar11 = pJVar3->bvFreeList;
      do {
        pBVar10 = pBVar4;
        pBVar4 = pBVar10->next;
        pBVar10->next = pBVar11;
        pBVar11 = pBVar10;
      } while (pBVar4 != (Type)0x0);
      pJVar3->bvFreeList = pBVar10;
    }
    pBVar2->head = (Type_conflict)0x0;
    pBVar2->lastFoundIndex = (Type_conflict)0x0;
    pBVar2->lastUsedNodePrevNextField = &pBVar2->head;
  }
  return;
}

Assistant:

void
BackwardPass::EndIntOverflowDoesNotMatterRange()
{
    if(intOverflowCurrentlyMattersInRange)
    {
        return;
    }
    intOverflowCurrentlyMattersInRange = true;

    if(currentBlock->intOverflowDoesNotMatterRange->FirstInstr()->m_next ==
        currentBlock->intOverflowDoesNotMatterRange->LastInstr())
    {
        // Don't need a range for a single-instruction range
        IntOverflowDoesNotMatterRange *const rangeToDelete = currentBlock->intOverflowDoesNotMatterRange;
        currentBlock->intOverflowDoesNotMatterRange = currentBlock->intOverflowDoesNotMatterRange->Next();
        currentBlock->RemoveInstr(rangeToDelete->LastInstr());
        rangeToDelete->Delete(globOpt->alloc);
    }
    else
    {
        // End the current range of instructions where int overflow does not matter
        IR::Instr *const boundaryInstr =
            IR::PragmaInstr::New(
                Js::OpCode::NoIntOverflowBoundary,
                0,
                currentBlock->intOverflowDoesNotMatterRange->FirstInstr()->m_func);
        boundaryInstr->SetByteCodeOffset(currentBlock->intOverflowDoesNotMatterRange->FirstInstr());
        currentBlock->InsertInstrBefore(boundaryInstr, currentBlock->intOverflowDoesNotMatterRange->FirstInstr());
        currentBlock->intOverflowDoesNotMatterRange->SetFirstInstr(boundaryInstr);

#if DBG_DUMP
        if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n"),
                func->GetJITFunctionBody()->GetDisplayName(),
                func->GetDebugNumberSet(debugStringBuffer),
                Js::PhaseNames[Js::BackwardPhase],
                currentBlock->GetBlockNum());
            Output::Print(_u("    Input syms to be int-specialized (lossless): "));
            candidateSymsRequiredToBeInt->Minus(
                currentBlock->intOverflowDoesNotMatterRange->SymsRequiredToBeInt(),
                currentBlock->intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()); // candidate bit-vectors are cleared below anyway
            candidateSymsRequiredToBeInt->Dump();
            Output::Print(_u("    Input syms to be converted to int (lossy):   "));
            currentBlock->intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Dump();
            Output::Print(_u("    First instr: "));
            currentBlock->intOverflowDoesNotMatterRange->FirstInstr()->m_next->Dump();
            Output::Flush();
        }
#endif
    }

    // Reset candidates for the next range
    candidateSymsRequiredToBeInt->ClearAll();
    candidateSymsRequiredToBeLossyInt->ClearAll();

    // Syms are not tracked across different ranges of instructions where int overflow does not matter, since instructions
    // between the ranges may bail out. The value of the dst of an int operation where overflow is ignored is incorrect until
    // the last use of that sym is converted to int. If the int operation and the last use of the sym are in different ranges
    // and an instruction between the ranges bails out, other inputs into the second range are no longer guaranteed to be ints,
    // so the incorrect value of the sym may be used in non-int operations.
    intOverflowDoesNotMatterInRangeBySymId->ClearAll();
}